

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWSImporter::ReadEnvelope(LWSImporter *this,Element *dad,Envelope *fill)

{
  bool bVar1;
  uint uVar2;
  _List_node_base *p_Var3;
  char *in;
  reference pEVar4;
  Logger *pLVar5;
  uint local_78;
  uint local_74;
  uint i;
  uint num;
  uint span;
  float f;
  Key *key;
  char *local_38;
  char *c;
  _List_const_iterator<Assimp::LWS::Element> local_28;
  const_iterator it;
  Envelope *fill_local;
  Element *dad_local;
  LWSImporter *this_local;
  
  it._M_node = (_List_node_base *)fill;
  bVar1 = std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::empty
                    (&dad->children);
  if (bVar1) {
    pLVar5 = DefaultLogger::get();
    Logger::error(pLVar5,"LWS: Envelope descriptions must not be empty");
  }
  else {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::begin
                   (&dad->children);
    p_Var3 = it._M_node + 1;
    std::_List_const_iterator<Assimp::LWS::Element>::operator->(&local_28);
    in = (char *)std::__cxx11::string::c_str();
    uVar2 = strtoul10(in,(char **)0x0);
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::reserve
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)p_Var3,(ulong)uVar2);
    std::_List_const_iterator<Assimp::LWS::Element>::operator++(&local_28);
    while( true ) {
      c = (char *)std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::
                  end(&dad->children);
      bVar1 = std::operator!=(&local_28,(_Self *)&c);
      if (!bVar1) break;
      std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_28);
      local_38 = (char *)std::__cxx11::string::c_str();
      pEVar4 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_28);
      bVar1 = std::operator==(pEVar4->tokens,"Key");
      if (bVar1) {
        p_Var3 = it._M_node + 1;
        LWO::Key::Key((Key *)&key);
        std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
                  ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)p_Var3,(Key *)&key
                  );
        _span = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::back
                          ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)
                           (it._M_node + 1));
        SkipSpaces<char>(&local_38);
        local_38 = fast_atoreal_move<float>(local_38,&_span->value,true);
        SkipSpaces<char>(&local_38);
        local_38 = fast_atoreal_move<float>(local_38,(float *)&num,true);
        _span->time = (double)(float)num;
        uVar2 = strtoul10(local_38,&local_38);
        local_74 = 0;
        switch(uVar2) {
        case 0:
          _span->inter = IT_TCB;
          local_74 = 5;
          break;
        case 1:
        case 2:
          _span->inter = IT_HERM;
          local_74 = 5;
          break;
        case 3:
          _span->inter = IT_LINE;
          local_74 = 0;
          break;
        case 4:
          _span->inter = IT_STEP;
          local_74 = 0;
          break;
        case 5:
          _span->inter = IT_BEZ2;
          local_74 = 4;
          break;
        default:
          pLVar5 = DefaultLogger::get();
          Logger::error(pLVar5,"LWS: Unknown span type");
        }
        for (local_78 = 0; local_78 < local_74; local_78 = local_78 + 1) {
          SkipSpaces<char>(&local_38);
          local_38 = fast_atoreal_move<float>(local_38,_span->params + local_78,true);
        }
      }
      else {
        pEVar4 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_28);
        bVar1 = std::operator==(pEVar4->tokens,"Behaviors");
        if (bVar1) {
          SkipSpaces<char>(&local_38);
          uVar2 = strtoul10(local_38,&local_38);
          *(uint *)&(it._M_node)->_M_prev = uVar2;
          SkipSpaces<char>(&local_38);
          uVar2 = strtoul10(local_38,&local_38);
          *(uint *)((long)&(it._M_node)->_M_prev + 4) = uVar2;
        }
      }
      std::_List_const_iterator<Assimp::LWS::Element>::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void LWSImporter::ReadEnvelope(const LWS::Element& dad, LWO::Envelope& fill )
{
    if (dad.children.empty()) {
        ASSIMP_LOG_ERROR("LWS: Envelope descriptions must not be empty");
        return;
    }

    // reserve enough storage
    std::list< LWS::Element >::const_iterator it = dad.children.begin();;
    fill.keys.reserve(strtoul10(it->tokens[1].c_str()));

    for (++it; it != dad.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        if ((*it).tokens[0] == "Key") {
            fill.keys.push_back(LWO::Key());
            LWO::Key& key = fill.keys.back();

            float f;
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,key.value);
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,f);

            key.time = f;

            unsigned int span = strtoul10(c,&c), num = 0;
            switch (span) {

                case 0:
                    key.inter = LWO::IT_TCB;
                    num = 5;
                    break;
                case 1:
                case 2:
                    key.inter = LWO::IT_HERM;
                    num = 5;
                    break;
                case 3:
                    key.inter = LWO::IT_LINE;
                    num = 0;
                    break;
                case 4:
                    key.inter = LWO::IT_STEP;
                    num = 0;
                    break;
                case 5:
                    key.inter = LWO::IT_BEZ2;
                    num = 4;
                    break;
                default:
                    ASSIMP_LOG_ERROR("LWS: Unknown span type");
            }
            for (unsigned int i = 0; i < num;++i) {
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c,key.params[i]);
            }
        }
        else if ((*it).tokens[0] == "Behaviors") {
            SkipSpaces(&c);
            fill.pre = (LWO::PrePostBehaviour) strtoul10(c,&c);
            SkipSpaces(&c);
            fill.post = (LWO::PrePostBehaviour) strtoul10(c,&c);
        }
    }
}